

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

ssize_t __thiscall gguf_writer::write(gguf_writer *this,int __fd,void *__buf,size_t __n)

{
  gguf_type gVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool *pbVar4;
  size_t __n_00;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  undefined4 in_register_00000034;
  gguf_kv *this_00;
  size_t i;
  ulong uVar5;
  uint64_t ne;
  size_t local_28;
  undefined4 local_1c;
  
  this_00 = (gguf_kv *)CONCAT44(in_register_00000034,__fd);
  local_28 = gguf_kv::get_ne(this_00);
  write(this,__fd,__buf_00,__n);
  if (this_00->is_array == true) {
    local_1c = 9;
    write(this,(int)&local_1c,__buf_01,__n);
    write(this,__fd + 0x24,__buf_02,__n);
    write<unsigned_long>(this,&local_28);
    __buf_03 = extraout_RDX;
  }
  else {
    write(this,__fd + 0x24,__buf_01,__n);
    __buf_03 = extraout_RDX_00;
  }
  gVar1 = this_00->type;
  uVar2 = (ulong)gVar1;
  if (gVar1 < GGUF_TYPE_COUNT) {
    __n_00 = 0x1c7f;
    if ((0x1c7fU >> (gVar1 & 0x1f) & 1) == 0) {
      if (gVar1 == GGUF_TYPE_BOOL) {
        for (uVar5 = 0; uVar5 < local_28; uVar5 = uVar5 + 1) {
          pbVar4 = gguf_kv::get_val<bool>(this_00,uVar5);
          uVar2 = write(this,(int)pbVar4,__buf_05,__n_00);
        }
      }
      else {
        if (gVar1 != GGUF_TYPE_STRING) goto LAB_00142cf9;
        for (uVar5 = 0; uVar5 < local_28; uVar5 = uVar5 + 1) {
          pbVar3 = gguf_kv::get_val<std::__cxx11::string>(this_00,uVar5);
          uVar2 = write(this,(int)pbVar3,__buf_04,__n_00);
        }
      }
    }
    else {
      uVar2 = write(this,__fd + 0x28,__buf_03,0x1c7f);
    }
    return uVar2;
  }
LAB_00142cf9:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,0x4c5,"invalid type");
}

Assistant:

void write(const struct gguf_kv & kv) const {
        const uint64_t ne = kv.get_ne();

        write(kv.get_key());

        if (kv.is_array) {
            write(GGUF_TYPE_ARRAY);
            write(kv.get_type());
            write(ne);
        } else {
            write(kv.get_type());
        }

        switch (kv.get_type()) {
            case GGUF_TYPE_UINT8:
            case GGUF_TYPE_INT8:
            case GGUF_TYPE_UINT16:
            case GGUF_TYPE_INT16:
            case GGUF_TYPE_UINT32:
            case GGUF_TYPE_INT32:
            case GGUF_TYPE_FLOAT32:
            case GGUF_TYPE_UINT64:
            case GGUF_TYPE_INT64:
            case GGUF_TYPE_FLOAT64: {
                write(kv.data);
            } break;
            case GGUF_TYPE_BOOL: {
                for (size_t i = 0; i < ne; ++i) {
                    write(kv.get_val<bool>(i));
                }
            } break;
            case GGUF_TYPE_STRING: {
                for (size_t i = 0; i < ne; ++i) {
                    write(kv.get_val<std::string>(i));
                }
            } break;
            case GGUF_TYPE_ARRAY:
            default: GGML_ABORT("invalid type");
        }
    }